

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::SListLeaf::SListLeaf
          (SListLeaf *this,TermList ts)

{
  SkipList<Inferences::ALASCA::SuperpositionConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::LDComparator>
  *in_RDI;
  Leaf *in_stack_ffffffffffffffd8;
  TermList in_stack_ffffffffffffffe0;
  
  SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::Leaf::Leaf
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe0);
  in_RDI->_left = (Node *)&PTR__SListLeaf_01311f50;
  Lib::
  SkipList<Inferences::ALASCA::SuperpositionConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::LDComparator>
  ::SkipList(in_RDI);
  return;
}

Assistant:

SListLeaf(TermList ts) : Leaf(ts) {}